

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Token * __thiscall
inja::Lexer::scan_body(Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind)

{
  string_view *this_00;
  byte bVar1;
  ulong uVar2;
  int iVar3;
  Kind kind;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar6 = close.size_;
  sVar5 = this->m_tok_start;
  if ((this->m_in).size_ <= sVar5) {
LAB_001a2123:
    uVar6 = (this->m_in).size_;
    local_40 = this->m_in;
    if (uVar6 < sVar5) {
      sVar5 = uVar6;
    }
    uVar4 = this->m_pos;
    if (this->m_pos < sVar5) {
      uVar4 = sVar5;
    }
    if (uVar6 <= uVar4) {
      uVar4 = uVar6;
    }
    sVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_40,sVar5,uVar4 - sVar5);
    __return_storage_ptr__->kind = Eof;
LAB_001a2163:
    __return_storage_ptr__->text = sVar7;
    return __return_storage_ptr__;
  }
  this_00 = &this->m_in;
LAB_001a20bf:
  bVar1 = this_00->data_[sVar5];
  if (((ulong)bVar1 < 0x21) && ((0x100002200U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
  goto LAB_001a2116;
  local_40 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_00,sVar5,0xffffffffffffffff);
  if ((local_40.size_ < uVar6) ||
     (iVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_40,0,uVar6,close), iVar3 != 0)) {
    if (bVar1 == 10) {
      sVar5 = this->m_tok_start;
      goto LAB_001a2116;
    }
    sVar5 = this->m_tok_start;
    uVar6 = sVar5 + 1;
    this->m_pos = uVar6;
    iVar3 = isalpha((int)(char)bVar1);
    if (iVar3 != 0) {
LAB_001a219b:
      scan_id(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (0x5a < bVar1) {
      if (bVar1 < 0x5f) {
        if (bVar1 == 0x5b) {
          kind = LeftBracket;
          goto LAB_001a23c9;
        }
        if (bVar1 == 0x5d) {
          kind = RightBracket;
          goto LAB_001a23c9;
        }
      }
      else {
        if (bVar1 == 0x5f) goto LAB_001a219b;
        if (bVar1 == 0x7b) {
          kind = LeftBrace;
          goto LAB_001a23c9;
        }
        if (bVar1 == 0x7d) {
          kind = RightBrace;
          goto LAB_001a23c9;
        }
      }
      goto switchD_001a2225_caseD_23;
    }
    switch(bVar1) {
    case 0x21:
      if ((uVar6 < (this->m_in).size_) && (this_00->data_[uVar6] == '=')) {
        this->m_pos = sVar5 + 2;
        kind = NotEqual;
        break;
      }
    default:
switchD_001a2225_caseD_23:
      kind = Unknown;
      break;
    case 0x22:
      scan_string(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      kind = LeftParen;
      break;
    case 0x29:
      kind = RightParen;
      break;
    case 0x2c:
      kind = Comma;
      break;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      scan_number(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x3a:
      kind = Colon;
      break;
    case 0x3c:
      if ((uVar6 < (this->m_in).size_) && (this_00->data_[uVar6] == '=')) {
        this->m_pos = sVar5 + 2;
        kind = LessEqual;
      }
      else {
        kind = LessThan;
      }
      break;
    case 0x3d:
      if ((uVar6 < (this->m_in).size_) && (this_00->data_[uVar6] == '=')) {
        this->m_pos = sVar5 + 2;
        kind = Equal;
        break;
      }
      goto switchD_001a2225_caseD_23;
    case 0x3e:
      if ((uVar6 < (this->m_in).size_) && (this_00->data_[uVar6] == '=')) {
        this->m_pos = sVar5 + 2;
        kind = GreaterEqual;
      }
      else {
        kind = GreaterThan;
      }
    }
LAB_001a23c9:
    make_token(__return_storage_ptr__,this,kind);
    return __return_storage_ptr__;
  }
  this->m_state = Text;
  uVar4 = this->m_tok_start;
  uVar6 = uVar6 + uVar4;
  this->m_pos = uVar6;
  uVar2 = (this->m_in).size_;
  local_40 = this->m_in;
  if (uVar2 < uVar4) {
    uVar4 = uVar2;
  }
  if (uVar6 < uVar4) {
    uVar6 = uVar4;
  }
  if (uVar2 <= uVar6) {
    uVar6 = uVar2;
  }
  sVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_40,uVar4,uVar6 - uVar4);
  __return_storage_ptr__->kind = closeKind;
  goto LAB_001a2163;
LAB_001a2116:
  sVar5 = sVar5 + 1;
  this->m_tok_start = sVar5;
  if ((this->m_in).size_ <= sVar5) goto LAB_001a2123;
  goto LAB_001a20bf;
}

Assistant:

Token scan_body(nonstd::string_view close, Token::Kind closeKind) {
	again:
		// skip whitespace (except for \n as it might be a close)
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);
		char ch = m_in[m_tok_start];
		if (ch == ' ' || ch == '\t' || ch == '\r') {
			m_tok_start += 1;
			goto again;
		}

		// check for close
		if (inja::string_view::starts_with(m_in.substr(m_tok_start), close)) {
			m_state = State::Text;
			m_pos = m_tok_start + close.size();
			return make_token(closeKind);
		}

		// skip \n
		if (ch == '\n') {
			m_tok_start += 1;
			goto again;
		}

		m_pos = m_tok_start + 1;
		if (std::isalpha(ch)) return scan_id();
		switch (ch) {
			case ',':
				return make_token(Token::Kind::Comma);
			case ':':
				return make_token(Token::Kind::Colon);
			case '(':
				return make_token(Token::Kind::LeftParen);
			case ')':
				return make_token(Token::Kind::RightParen);
			case '[':
				return make_token(Token::Kind::LeftBracket);
			case ']':
				return make_token(Token::Kind::RightBracket);
			case '{':
				return make_token(Token::Kind::LeftBrace);
			case '}':
				return make_token(Token::Kind::RightBrace);
			case '>':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::GreaterEqual);
				}
				return make_token(Token::Kind::GreaterThan);
			case '<':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::LessEqual);
				}
				return make_token(Token::Kind::LessThan);
			case '=':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::Equal);
				}
				return make_token(Token::Kind::Unknown);
			case '!':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::NotEqual);
				}
				return make_token(Token::Kind::Unknown);
			case '\"':
				return scan_string();
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '-':
				return scan_number();
			case '_':
				return scan_id();
			default:
				return make_token(Token::Kind::Unknown);
		}
	}